

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cc
# Opt level: O3

void sptk::world::anon_unknown_0::GetWindowedWaveform
               (double *x,int x_length,int fs,double current_f0,double current_position,
               int window_type,double window_length_ratio,double *waveform,RandnState *randn_state)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  dVar14 = (double)fs;
  uVar4 = matlab_round(((dVar14 * window_length_ratio) / current_f0) * 0.5);
  uVar1 = uVar4 * 2;
  lVar11 = (long)(int)(uVar4 * 2 + 1);
  uVar13 = lVar11 * 4;
  uVar12 = lVar11 << 3;
  if ((int)uVar4 < 0) {
    uVar13 = 0xffffffffffffffff;
    uVar12 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar13);
  pvVar7 = operator_new__(uVar13);
  pvVar8 = operator_new__(uVar12);
  auVar3 = _DAT_00118a10;
  auVar2 = _DAT_00118a00;
  if ((int)uVar4 < 0) {
    matlab_round(current_position * dVar14 + 0.001);
  }
  else {
    auVar18._4_4_ = 0;
    auVar18._0_4_ = uVar1;
    auVar18._8_4_ = uVar1;
    auVar18._12_4_ = 0;
    lVar11 = (ulong)uVar4 * 4 + (long)(int)uVar4 * -4;
    lVar10 = 0;
    auVar18 = auVar18 ^ _DAT_00118a10;
    do {
      iVar5 = (int)lVar10;
      auVar17._8_4_ = iVar5;
      auVar17._0_8_ = lVar10;
      auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar17 = (auVar17 | auVar2) ^ auVar3;
      if ((bool)(~(auVar17._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar17._0_4_ ||
                  auVar18._4_4_ < auVar17._4_4_) & 1)) {
        *(uint *)((long)pvVar6 + lVar10 * 4 + lVar11) = -uVar4 + iVar5;
      }
      if ((auVar17._12_4_ != auVar18._12_4_ || auVar17._8_4_ <= auVar18._8_4_) &&
          auVar17._12_4_ <= auVar18._12_4_) {
        *(uint *)((long)pvVar6 + lVar10 * 4 + lVar11 + 4) = -uVar4 + iVar5 + 1;
      }
      lVar10 = lVar10 + 2;
    } while ((ulong)uVar1 + 2 != lVar10);
    iVar5 = matlab_round(current_position * dVar14 + 0.001);
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    uVar12 = (ulong)(uVar4 | 1);
    uVar13 = 0;
    do {
      iVar9 = *(int *)((long)pvVar6 + uVar13 * 4) + iVar5;
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      if (x_length + -1 < iVar9) {
        iVar9 = x_length + -1;
      }
      *(int *)((long)pvVar7 + uVar13 * 4) = iVar9;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
    if (window_type == 1) {
      uVar13 = 0;
      do {
        dVar15 = (double)*(int *)((long)pvVar6 + uVar13 * 4);
        dVar15 = cos((((dVar15 + dVar15) / window_length_ratio) / dVar14) * 3.141592653589793 *
                     current_f0);
        *(double *)((long)pvVar8 + uVar13 * 8) = dVar15 * 0.5 + 0.5;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
    else {
      uVar13 = 0;
      do {
        dVar15 = (double)*(int *)((long)pvVar6 + uVar13 * 4);
        dVar15 = (((dVar15 + dVar15) / window_length_ratio) / dVar14) * 3.141592653589793 *
                 current_f0;
        dVar16 = cos(dVar15);
        dVar15 = cos(dVar15 + dVar15);
        *(double *)((long)pvVar8 + uVar13 * 8) = dVar15 * 0.08 + dVar16 * 0.5 + 0.42;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
  }
  if (-1 < (int)uVar1) {
    lVar11 = 0;
    do {
      dVar14 = x[*(int *)((long)pvVar7 + lVar11 * 4)];
      dVar15 = *(double *)((long)pvVar8 + lVar11 * 8);
      dVar16 = randn(randn_state);
      waveform[lVar11] = dVar16 * 1e-06 + dVar14 * dVar15;
      lVar11 = lVar11 + 1;
    } while ((ulong)uVar1 + 1 != lVar11);
    if (-1 < (int)uVar1) {
      dVar15 = 0.0;
      uVar13 = 0;
      dVar14 = 0.0;
      do {
        dVar14 = dVar14 + waveform[uVar13];
        dVar15 = dVar15 + *(double *)((long)pvVar8 + uVar13 * 8);
        uVar13 = uVar13 + 1;
      } while ((uVar1 | 1) != uVar13);
      if (-1 < (int)uVar1) {
        uVar13 = 0;
        do {
          waveform[uVar13] =
               waveform[uVar13] - *(double *)((long)pvVar8 + uVar13 * 8) * (dVar14 / dVar15);
          uVar13 = uVar13 + 1;
        } while ((uVar1 | 1) != uVar13);
      }
    }
  }
  operator_delete__(pvVar6);
  operator_delete__(pvVar7);
  operator_delete__(pvVar8);
  return;
}

Assistant:

static void GetWindowedWaveform(const double *x, int x_length, int fs,
    double current_f0, double current_position, int window_type,
    double window_length_ratio, double *waveform, RandnState *randn_state) {
  int half_window_length =
    matlab_round(window_length_ratio * fs / current_f0 / 2.0);

  int *base_index = new int[half_window_length * 2 + 1];
  int *safe_index = new int[half_window_length * 2 + 1];
  double *window  = new double[half_window_length * 2 + 1];

  SetParametersForGetWindowedWaveform(half_window_length, x_length,
      current_position, fs, current_f0, window_type, window_length_ratio,
      base_index, safe_index, window);

  // F0-adaptive windowing
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] =
      x[safe_index[i]] * window[i] + randn(randn_state) * world::kSafeGuardD4C;

  double tmp_weight1 = 0;
  double tmp_weight2 = 0;
  for (int i = 0; i <= half_window_length * 2; ++i) {
    tmp_weight1 += waveform[i];
    tmp_weight2 += window[i];
  }
  double weighting_coefficient = tmp_weight1 / tmp_weight2;
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] -= window[i] * weighting_coefficient;

  delete[] base_index;
  delete[] safe_index;
  delete[] window;
}